

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

bool testing::internal::BoolFromGTestEnv(char *flag,bool default_value)

{
  int iVar1;
  String *this;
  byte in_SIL;
  char *in_stack_00000018;
  char *string_value;
  String env_var;
  byte local_51;
  String local_20;
  byte local_9;
  
  local_9 = in_SIL & 1;
  FlagToEnvVar(in_stack_00000018);
  String::c_str(&local_20);
  this = (String *)posix::GetEnv((char *)0x23d4b1);
  if (this == (String *)0x0) {
    local_51 = local_9;
  }
  else {
    iVar1 = strcmp((char *)this,"0");
    local_51 = iVar1 != 0;
  }
  String::~String(this);
  return (bool)(local_51 & 1);
}

Assistant:

bool BoolFromGTestEnv(const char* flag, bool default_value) {
  const String env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  return string_value == NULL ?
      default_value : strcmp(string_value, "0") != 0;
}